

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cpp
# Opt level: O0

void flatbuffers::tests::anon_unknown_2::NumericUtilsTestFloat<float>(char *lower,char *upper)

{
  bool bVar1;
  float val;
  float fVar2;
  float local_1c;
  char *pcStack_18;
  float f;
  char *upper_local;
  char *lower_local;
  
  pcStack_18 = upper;
  upper_local = lower;
  bVar1 = StringToNumber<float>("",&local_1c);
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(\"\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1b,"");
  bVar1 = StringToNumber<float>("1q",&local_1c);
  TestEq<bool,bool>(bVar1,false,"\'flatbuffers::StringToNumber(\"1q\", &f)\' != \'false\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1c,"");
  TestEq<float,int>(local_1c,0,"\'f\' != \'0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1d,"");
  bVar1 = StringToNumber<float>(pcStack_18,&local_1c);
  TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(upper, &f)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x1e,"");
  fVar2 = local_1c;
  val = std::numeric_limits<float>::infinity();
  TestEq<float,float>(fVar2,val,"\'f\' != \'+flatbuffers::numeric_limits<T>::infinity()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                      ,0x1f,"");
  bVar1 = StringToNumber<float>(upper_local,&local_1c);
  TestEq<bool,bool>(bVar1,true,"\'flatbuffers::StringToNumber(lower, &f)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                    ,0x20,"");
  fVar2 = std::numeric_limits<float>::infinity();
  TestEq<float,float>(local_1c,-fVar2,"\'f\' != \'-flatbuffers::numeric_limits<T>::infinity()\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/util_test.cpp"
                      ,0x21,"");
  return;
}

Assistant:

void NumericUtilsTestFloat(const char *lower, const char *upper) {
  T f;
  TEST_EQ(flatbuffers::StringToNumber("", &f), false);
  TEST_EQ(flatbuffers::StringToNumber("1q", &f), false);
  TEST_EQ(f, 0);
  TEST_EQ(flatbuffers::StringToNumber(upper, &f), true);
  TEST_EQ(f, +flatbuffers::numeric_limits<T>::infinity());
  TEST_EQ(flatbuffers::StringToNumber(lower, &f), true);
  TEST_EQ(f, -flatbuffers::numeric_limits<T>::infinity());
}